

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BandedAlign.h
# Opt level: O0

int __thiscall
BandedAlign<Protein>::Align
          (BandedAlign<Protein> *this,Sequence<Protein> *A,Sequence<Protein> *B,Cigar *cigar,
          AlignmentDirection dir,size_t startA,size_t startB,size_t endA,size_t endB)

{
  Cigar *pCVar1;
  char cVar2;
  char cVar3;
  int8_t iVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_type sVar9;
  ulong uVar10;
  long lVar11;
  reference pvVar12;
  reference pvVar13;
  unsigned_long *puVar14;
  size_t index;
  reference pvVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  byte local_281;
  byte local_280;
  value_type local_27d;
  size_t local_260;
  unsigned_long local_248;
  byte local_239;
  bool local_224;
  bool local_223;
  bool local_222;
  bool local_221;
  long local_1e8;
  long local_1e0;
  size_t local_1d8;
  size_t local_1d0;
  CigarEntry local_1c0;
  size_t local_1b8;
  size_t remainingA;
  reference local_1a8;
  Gap *verticalGap_1;
  size_t remainingB;
  int score;
  CigarOp op_1;
  CigarEntry ce;
  size_t by;
  size_t bx;
  bool isTerminalB;
  bool isTerminalA;
  CigarOp op;
  Gap *verticalGap;
  bool match;
  size_t bIdx;
  size_t aIdx;
  unsigned_long uStack_148;
  int diagScore;
  unsigned_long local_140;
  unsigned_long local_138;
  size_t rightBound;
  unsigned_long local_128;
  unsigned_long local_120;
  size_t leftBound;
  int score_1;
  bool hitEnd;
  size_t center;
  size_t y;
  size_t x;
  Gap horizontalGap;
  bool fromEndB;
  bool fromEndA;
  bool fromBeginningB;
  bool fromBeginningA;
  size_t bw;
  vector<CigarOp,_std::allocator<CigarOp>_> local_d0;
  allocator<BandedAlign<Protein>::Gap> local_b1;
  Gap local_b0;
  vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_> local_a0;
  allocator<int> local_75;
  int local_74;
  vector<int,_std::allocator<int>_> local_70;
  size_t local_58;
  size_t lenB;
  size_t lenA;
  size_t height;
  size_t width;
  size_t startA_local;
  Cigar *pCStack_28;
  AlignmentDirection dir_local;
  Cigar *cigar_local;
  Sequence<Protein> *B_local;
  Sequence<Protein> *A_local;
  BandedAlign<Protein> *this_local;
  
  width = startA;
  startA_local._4_4_ = dir;
  pCStack_28 = cigar;
  cigar_local = (Cigar *)B;
  B_local = A;
  A_local = (Sequence<Protein> *)this;
  lenB = Sequence<Protein>::Length(A);
  local_58 = Sequence<Protein>::Length((Sequence<Protein> *)cigar_local);
  if (endA == 0xffffffffffffffff) {
    if (startA_local._4_4_ == Forward) {
      local_1d0 = lenB;
    }
    else {
      local_1d0 = 0;
    }
    endA = local_1d0;
  }
  if (endB == 0xffffffffffffffff) {
    local_1d8 = local_58;
    if (startA_local._4_4_ != Forward) {
      local_1d8 = 0;
    }
    endB = local_1d8;
  }
  if (lenB < width) {
    width = lenB;
  }
  if (local_58 < startB) {
    startB = local_58;
  }
  if (lenB < endA) {
    endA = lenB;
  }
  if (local_58 < endB) {
    endB = local_58;
  }
  if (width < endA) {
    local_1e0 = endA - width;
  }
  else {
    local_1e0 = width - endA;
  }
  height = local_1e0 + 1;
  if (startB < endB) {
    local_1e8 = endB - startB;
  }
  else {
    local_1e8 = startB - endB;
  }
  lenA = local_1e8 + 1;
  sVar9 = std::vector<int,_std::allocator<int>_>::capacity(&this->mScores);
  if (sVar9 < height) {
    auVar17._8_4_ = (int)(height >> 0x20);
    auVar17._0_8_ = height;
    auVar17._12_4_ = 0x45300000;
    dVar16 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)height) - 4503599627370496.0)) * 1.5;
    uVar10 = (ulong)dVar16;
    local_74 = MinInt();
    std::allocator<int>::allocator(&local_75);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_70,uVar10 | (long)(dVar16 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f,
               &local_74,&local_75);
    std::vector<int,_std::allocator<int>_>::operator=(&this->mScores,&local_70);
    std::vector<int,_std::allocator<int>_>::~vector(&local_70);
    std::allocator<int>::~allocator(&local_75);
  }
  sVar9 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
          capacity(&this->mVerticalGaps);
  if (sVar9 < height) {
    auVar18._8_4_ = (int)(height >> 0x20);
    auVar18._0_8_ = height;
    auVar18._12_4_ = 0x45300000;
    dVar16 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)height) - 4503599627370496.0)) * 1.5;
    uVar10 = (ulong)dVar16;
    Gap::Gap(&local_b0,&this->mParams);
    std::allocator<BandedAlign<Protein>::Gap>::allocator(&local_b1);
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::vector
              (&local_a0,uVar10 | (long)(dVar16 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f,
               &local_b0,&local_b1);
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::operator=
              (&this->mVerticalGaps,&local_a0);
    std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::~vector
              (&local_a0);
    std::allocator<BandedAlign<Protein>::Gap>::~allocator(&local_b1);
  }
  sVar9 = std::vector<CigarOp,_std::allocator<CigarOp>_>::capacity(&this->mOperations);
  if (sVar9 < height * lenA) {
    lVar11 = height * lenA;
    auVar19._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar19._0_8_ = lVar11;
    auVar19._12_4_ = 0x45300000;
    dVar16 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) * 1.5;
    uVar10 = (ulong)dVar16;
    std::allocator<CigarOp>::allocator((allocator<CigarOp> *)((long)&bw + 7));
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              (&local_d0,uVar10 | (long)(dVar16 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f,
               (allocator<CigarOp> *)((long)&bw + 7));
    std::vector<CigarOp,_std::allocator<CigarOp>_>::operator=(&this->mOperations,&local_d0);
    std::vector<CigarOp,_std::allocator<CigarOp>_>::~vector(&local_d0);
    std::allocator<CigarOp>::~allocator((allocator<CigarOp> *)((long)&bw + 7));
  }
  uVar10 = (this->mParams).bandwidth;
  local_221 = width == 0 || width == lenB;
  horizontalGap.mParams._7_1_ = local_221;
  local_222 = startB == 0 || startB == local_58;
  horizontalGap.mParams._6_1_ = local_222;
  local_223 = endA == 0 || endA == lenB;
  horizontalGap.mParams._5_1_ = local_223;
  local_224 = endB == 0 || endB == local_58;
  horizontalGap.mParams._4_1_ = local_224;
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,0);
  *pvVar12 = 0;
  pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
            operator[](&this->mVerticalGaps,0);
  Gap::Reset(pvVar13);
  pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
            operator[](&this->mVerticalGaps,0);
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,0);
  Gap::OpenOrExtend(pvVar13,*pvVar12,(bool)(horizontalGap.mParams._6_1_ & 1),1);
  Gap::Gap((Gap *)&x,&this->mParams);
  y = 1;
  while ((y < height && ((y <= uVar10 || (lenA < 2))))) {
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,y - 1);
    Gap::OpenOrExtend((Gap *)&x,*pvVar12,(bool)(horizontalGap.mParams._7_1_ & 1),1);
    iVar6 = Gap::Score((Gap *)&x);
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,y);
    *pvVar12 = iVar6;
    pvVar15 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[](&this->mOperations,y);
    *pvVar15 = Insertion;
    pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
              operator[](&this->mVerticalGaps,y);
    Gap::Reset(pvVar13);
    y = y + 1;
  }
  if (y < height) {
    iVar6 = MinInt();
    pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,y);
    *pvVar12 = iVar6;
    pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
              operator[](&this->mVerticalGaps,y);
    Gap::Reset(pvVar13);
  }
  _score_1 = 1;
  leftBound._7_1_ = false;
  center = 1;
  while( true ) {
    local_239 = 0;
    if (center < lenA) {
      local_239 = leftBound._7_1_ ^ 0xff;
    }
    if ((local_239 & 1) == 0) break;
    leftBound._0_4_ = MinInt();
    if (uVar10 < _score_1) {
      local_248 = _score_1 - uVar10;
    }
    else {
      local_248 = 0;
    }
    local_128 = local_248;
    rightBound = height - 1;
    puVar14 = std::min<unsigned_long>(&local_128,&rightBound);
    local_120 = *puVar14;
    local_140 = _score_1 + uVar10;
    uStack_148 = height - 1;
    puVar14 = std::min<unsigned_long>(&local_140,&stack0xfffffffffffffeb8);
    local_138 = *puVar14;
    aIdx._4_4_ = MinInt();
    if (local_120 != 0) {
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,local_120 - 1);
      aIdx._4_4_ = *pvVar12;
      iVar6 = MinInt();
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,local_120 - 1);
      *pvVar12 = iVar6;
      pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
                operator[](&this->mVerticalGaps,local_120 - 1);
      Gap::Reset(pvVar13);
    }
    Gap::Reset((Gap *)&x);
    for (y = local_120; y <= local_138; y = y + 1) {
      if (y != 0) {
        if (startA_local._4_4_ == Forward) {
          index = (width + y) - 1;
          local_260 = (startB + center) - 1;
        }
        else {
          index = width - y;
          local_260 = startB - center;
        }
        cVar2 = Sequence<Protein>::operator[](B_local,index);
        cVar3 = Sequence<Protein>::operator[]((Sequence<Protein> *)cigar_local,local_260);
        verticalGap._7_1_ = MatchPolicy<Protein>::Match(cVar2,cVar3);
        cVar2 = Sequence<Protein>::operator[](B_local,index);
        cVar3 = Sequence<Protein>::operator[]((Sequence<Protein> *)cigar_local,local_260);
        iVar4 = ScorePolicy<Protein>::Score(cVar2,cVar3);
        leftBound._0_4_ = aIdx._4_4_ + iVar4;
      }
      iVar6 = (int)leftBound;
      iVar7 = Gap::Score((Gap *)&x);
      if (iVar6 < iVar7) {
        leftBound._0_4_ = Gap::Score((Gap *)&x);
      }
      pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
                operator[](&this->mVerticalGaps,y);
      iVar6 = (int)leftBound;
      iVar7 = Gap::Score(pvVar13);
      if (iVar6 < iVar7) {
        leftBound._0_4_ = Gap::Score(pvVar13);
      }
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,y);
      iVar6 = (int)leftBound;
      aIdx._4_4_ = *pvVar12;
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,y);
      iVar7 = (int)leftBound;
      *pvVar12 = iVar6;
      iVar8 = Gap::Score((Gap *)&x);
      iVar6 = (int)leftBound;
      if (iVar7 == iVar8) {
        bx._7_1_ = Insertion;
      }
      else {
        iVar7 = Gap::Score(pvVar13);
        if (iVar6 == iVar7) {
          bx._7_1_ = Deletion;
        }
        else {
          local_27d = Match;
          if ((verticalGap._7_1_ & 1) == 0) {
            local_27d = Mismatch;
          }
          bx._7_1_ = local_27d;
        }
      }
      pvVar15 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[]
                          (&this->mOperations,center * height + y);
      *pvVar15 = bx._7_1_;
      if ((y == 0) || (local_280 = 0, y == height - 1)) {
        local_280 = horizontalGap.mParams._5_1_;
      }
      if ((center == 0) || (local_281 = 0, center == lenA - 1)) {
        local_281 = horizontalGap.mParams._4_1_;
      }
      Gap::OpenOrExtend((Gap *)&x,(int)leftBound,(bool)(local_281 & 1),1);
      Gap::OpenOrExtend(pvVar13,(int)leftBound,(bool)(local_280 & 1),1);
    }
    if (local_138 + 1 < height) {
      iVar6 = MinInt();
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,local_138 + 1);
      *pvVar12 = iVar6;
      pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
                operator[](&this->mVerticalGaps,local_138 + 1);
      Gap::Reset(pvVar13);
    }
    leftBound._7_1_ = local_138 == local_120;
    _score_1 = _score_1 + 1;
    center = center + 1;
  }
  if (pCStack_28 != (Cigar *)0x0) {
    by = y - 1;
    ce = (CigarEntry)(center - 1);
    CigarEntry::CigarEntry((CigarEntry *)&score);
    Cigar::Clear(pCStack_28);
    while (by != 0 || ce != (CigarEntry)0x0) {
      pvVar15 = std::vector<CigarOp,_std::allocator<CigarOp>_>::operator[]
                          (&this->mOperations,(long)ce * height + by);
      remainingB._7_1_ = *pvVar15;
      Cigar::Add(pCStack_28,(CigarOp *)((long)&remainingB + 7));
      switch(remainingB._7_1_) {
      case Match:
        by = by - 1;
        ce = (CigarEntry)((long)ce + -1);
        break;
      default:
        break;
      case Deletion:
        ce = (CigarEntry)((long)ce + -1);
        break;
      case Insertion:
        by = by - 1;
        break;
      case Mismatch:
        by = by - 1;
        ce = (CigarEntry)((long)ce + -1);
      }
    }
    Cigar::Reverse(pCStack_28);
  }
  pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&this->mScores,y - 1);
  iVar6 = *pvVar12;
  remainingB._0_4_ = iVar6;
  if (y == height) {
    verticalGap_1 = (Gap *)(lenA - center);
    pvVar13 = std::vector<BandedAlign<Protein>::Gap,_std::allocator<BandedAlign<Protein>::Gap>_>::
              operator[](&this->mVerticalGaps,y - 1);
    iVar6 = (int)remainingB;
    local_1a8 = pvVar13;
    bVar5 = Gap::IsTerminal(pvVar13);
    Gap::OpenOrExtend(pvVar13,iVar6,bVar5,(size_t)verticalGap_1);
    remainingB._0_4_ = Gap::Score(local_1a8);
    pCVar1 = pCStack_28;
    if ((pCStack_28 != (Cigar *)0x0) && (verticalGap_1 != (Gap *)0x0)) {
      CigarEntry::CigarEntry((CigarEntry *)&remainingA,(int)verticalGap_1,Deletion);
      Cigar::Add(pCVar1,(CigarEntry *)&remainingA);
    }
  }
  else if (center == lenA) {
    local_1b8 = height - y;
    bVar5 = Gap::IsTerminal((Gap *)&x);
    Gap::OpenOrExtend((Gap *)&x,iVar6,bVar5,local_1b8);
    remainingB._0_4_ = Gap::Score((Gap *)&x);
    pCVar1 = pCStack_28;
    if ((pCStack_28 != (Cigar *)0x0) && (local_1b8 != 0)) {
      CigarEntry::CigarEntry(&local_1c0,(int)local_1b8,Insertion);
      Cigar::Add(pCVar1,&local_1c0);
    }
  }
  if ((pCStack_28 != (Cigar *)0x0) && (startA_local._4_4_ == Reverse)) {
    Cigar::Reverse(pCStack_28);
  }
  return (int)remainingB;
}

Assistant:

int Align( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
             Cigar*                   cigar = NULL,
             const AlignmentDirection dir   = AlignmentDirection::Forward,
             size_t startA = 0, size_t startB = 0, size_t endA = -1,
             size_t endB = -1 ) {
    // Calculate matrix width, depending on alignment
    // direction and length of sequences
    // A will be on the X axis (width of matrix)
    // B will be on the Y axis (height of matrix)
    size_t width, height;

    size_t lenA = A.Length();
    size_t lenB = B.Length();

    if( endA == ( size_t ) -1 ) {
      endA = ( dir == AlignmentDirection::Forward ? lenA : 0 );
    }

    if( endB == ( size_t ) -1 ) {
      endB = ( dir == AlignmentDirection::Forward ? lenB : 0 );
    }

    if( startA > lenA )
      startA = lenA;
    if( startB > lenB )
      startB = lenB;
    if( endA > lenA )
      endA = lenA;
    if( endB > lenB )
      endB = lenB;

    width  = ( endA > startA ? endA - startA : startA - endA ) + 1;
    height = ( endB > startB ? endB - startB : startB - endB ) + 1;

    // Make sure we have enough cells
    if( mScores.capacity() < width ) {
      mScores = Scores( width * 1.5, MinInt() );
    }

    if( mVerticalGaps.capacity() < width ) {
      mVerticalGaps = Gaps( width * 1.5, mParams );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    // Initialize first row
    size_t bw = mParams.bandwidth;

    bool fromBeginningA = ( startA == 0 || startA == lenA );
    bool fromBeginningB = ( startB == 0 || startB == lenB );

    bool fromEndA = ( endA == 0 || endA == lenA );
    bool fromEndB = ( endB == 0 || endB == lenB );

    mScores[ 0 ] = 0;

    mVerticalGaps[ 0 ].Reset();
    mVerticalGaps[ 0 ].OpenOrExtend( mScores[ 0 ], fromBeginningB );

    Gap horizontalGap( mParams );

    size_t x, y;
    for( x = 1; x < width; x++ ) {
      if( x > bw && height > 1 ) // only break on BW bound if B is not empty
        break;

      horizontalGap.OpenOrExtend( mScores[ x - 1 ], fromBeginningA );
      mScores[ x ]     = horizontalGap.Score();
      mOperations[ x ] = CigarOp::Insertion;
      mVerticalGaps[ x ].Reset();
    }
    if( x < width ) {
      mScores[ x ] = MinInt();
      mVerticalGaps[ x ].Reset();
    }
    /* PrintRow( width ); */

    // Row by row...
    size_t center = 1;
    bool   hitEnd = false;
    for( y = 1; y < height && !hitEnd; y++ ) {
      int score = MinInt();

      // Calculate band bounds
      size_t leftBound =
        std::min( center > bw ? ( center - bw ) : 0, width - 1 );
      size_t rightBound = std::min( center + bw, width - 1 );

      // Set diagonal score for first calculated cell in row
      int diagScore = MinInt();
      if( leftBound > 0 ) {
        diagScore                = mScores[ leftBound - 1 ];
        mScores[ leftBound - 1 ] = MinInt();
        mVerticalGaps[ leftBound - 1 ].Reset();
      }

      // Calculate row within the band bounds
      horizontalGap.Reset();
      for( x = leftBound; x <= rightBound; x++ ) {
        // Calculate diagonal score
        size_t aIdx = 0, bIdx = 0;
        bool   match;
        if( x > 0 ) {
          aIdx =
            ( dir == AlignmentDirection::Forward ) ? startA + x - 1 : startA - x;
          bIdx =
            ( dir == AlignmentDirection::Forward ) ? startB + y - 1 : startB - y;
          // diagScore: score at col-1, row-1
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // Select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < horizontalGap.Score() )
          score = horizontalGap.Score();

        Gap& verticalGap = mVerticalGaps[ x ];
        if( score < verticalGap.Score() )
          score = verticalGap.Score();

        // Save the prev score at (x - 1) which
        // we will use to compute the diagonal score at (x)
        diagScore = mScores[ x ];

        // Save new score
        mScores[ x ] = score;

        CigarOp op;
        if( score == horizontalGap.Score() ) {
          op = CigarOp::Insertion;
        } else if( score == verticalGap.Score() ) {
          op = CigarOp::Deletion;
        } else {
          op = match ? CigarOp::Match : CigarOp::Mismatch;
        }
        mOperations[ y * width + x ] = op;

        // Calculate potential gaps
        bool isTerminalA = ( x == 0 || x == width - 1 ) && fromEndA;
        bool isTerminalB = ( y == 0 || y == height - 1 ) && fromEndB;

        horizontalGap.OpenOrExtend( score, isTerminalB );
        verticalGap.OpenOrExtend( score, isTerminalA );
      }

      if( rightBound + 1 < width ) {
        mScores[ rightBound + 1 ] = MinInt();
        mVerticalGaps[ rightBound + 1 ].Reset();
      }

      hitEnd = ( rightBound == leftBound );

      /* PrintRow( width ); */

      // Move one cell over for the next row
      center++;
    }

    // Backtrack
    if( cigar ) {
      size_t bx = x - 1;
      size_t by = y - 1;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      cigar->Reverse();
    }

    // Calculate score & cut corners
    int score = mScores[ x - 1 ];
    if( x == width ) {
      // We reached the end of A, emulate going down on B (vertical gaps)
      size_t remainingB  = height - y;
      Gap&   verticalGap = mVerticalGaps[ x - 1 ];
      verticalGap.OpenOrExtend( score, verticalGap.IsTerminal(), remainingB );
      score = verticalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingB ) {
        cigar->Add( CigarEntry( remainingB, CigarOp::Deletion ) );
      }
    } else if( y == height ) {
      // We reached the end of B, emulate going down on A (horizontal gaps)
      size_t remainingA = width - x;
      horizontalGap.OpenOrExtend( score, horizontalGap.IsTerminal(),
                                  remainingA );
      score = horizontalGap.Score();

      // Add tails to backtrack info
      if( cigar && remainingA ) {
        cigar->Add( CigarEntry( remainingA, CigarOp::Insertion ) );
      }
    }

    if( cigar && dir == AlignmentDirection::Reverse ) {
      cigar->Reverse();
    }

    return score;
  }